

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

bool __thiscall QHstsHeaderParser::parseSTSHeader(QHstsHeaderParser *this)

{
  bool bVar1;
  QHstsHeaderParser *this_00;
  qsizetype qVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QDateTime *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  QByteArray *lhs;
  bool local_19;
  QDateTime local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  QDateTime::QDateTime(local_10);
  QDateTime::operator=
            ((QDateTime *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
             in_stack_ffffffffffffffb8);
  QDateTime::~QDateTime(local_10);
  *(undefined1 *)((long)&in_RDI[2].d.ptr + 4) = 0;
  *(undefined1 *)&in_RDI[3].d.d = 0;
  in_RDI[2].d.size = 0;
  *(undefined4 *)&in_RDI[2].d.ptr = 0;
  QByteArray::clear();
  while( true ) {
    this_00 = (QHstsHeaderParser *)(long)*(int *)&in_RDI[2].d.ptr;
    qVar2 = QByteArray::size(in_RDI);
    if (qVar2 <= (long)this_00) {
      local_19 = true;
      goto LAB_0017a2b1;
    }
    bVar1 = parseDirective(this_00);
    if (!bVar1) break;
    qVar2 = QByteArray::size(in_RDI + 1);
    bVar1 = false;
    if (qVar2 != 0) {
      bVar1 = ::operator!=(lhs,(char **)in_RDI);
    }
    if (bVar1 != false) {
      local_19 = false;
LAB_0017a2b1:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_19;
    }
  }
  local_19 = false;
  goto LAB_0017a2b1;
}

Assistant:

bool QHstsHeaderParser::parseSTSHeader()
{
    expiry = QDateTime();
    maxAgeFound = false;
    subDomainsFound = false;
    maxAge = 0;
    tokenPos = 0;
    token.clear();

    while (tokenPos < header.size()) {
        if (!parseDirective())
            return false;

        if (token.size() && token != ";") {
            // After a directive we can only have a ";" or no more tokens.
            // Invalid syntax.
            return false;
        }
    }

    return true;
}